

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

int EmitParameter(VMFunctionBuilder *build,FxExpression *operand,FScriptPosition *pos)

{
  int opb;
  ExpEmit reg;
  ExpEmit local_30;
  ExpEmit where;
  FScriptPosition *pos_local;
  FxExpression *operand_local;
  VMFunctionBuilder *build_local;
  undefined4 extraout_var;
  
  where = (ExpEmit)pos;
  reg._0_4_ = (*operand->_vptr_FxExpression[9])(operand,build);
  reg.Konst = (bool)(char)extraout_var;
  reg.Fixed = (bool)(char)((uint)extraout_var >> 8);
  reg.Final = (bool)(char)((uint)extraout_var >> 0x10);
  reg.Target = (bool)(char)((uint)extraout_var >> 0x18);
  local_30.RegType = (uint8_t)((uint)reg._0_4_ >> 0x10);
  local_30 = reg;
  if (local_30.RegType == 0x80) {
    FScriptPosition::Message((FScriptPosition *)where,2,"Attempted to pass a non-value");
    VMFunctionBuilder::Emit(build,0x46,0,(uint)local_30.RegType,(uint)local_30.RegNum);
    build_local._4_4_ = 1;
  }
  else {
    opb = EncodeRegType(reg);
    VMFunctionBuilder::Emit(build,0x46,0,opb,(uint)local_30.RegNum);
    ExpEmit::Free(&local_30,build);
    build_local._4_4_ = (uint)local_30.RegCount;
  }
  return build_local._4_4_;
}

Assistant:

static int EmitParameter(VMFunctionBuilder *build, FxExpression *operand, const FScriptPosition &pos)
{
	ExpEmit where = operand->Emit(build);

	if (where.RegType == REGT_NIL)
	{
		pos.Message(MSG_ERROR, "Attempted to pass a non-value");
		build->Emit(OP_PARAM, 0, where.RegType, where.RegNum);
		return 1;
	}
	else
	{
		build->Emit(OP_PARAM, 0, EncodeRegType(where), where.RegNum);
		where.Free(build);
		return where.RegCount;
	}
}